

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcPolyline::~IfcPolyline(IfcPolyline *this)

{
  ~IfcPolyline((IfcPolyline *)&this[-1].super_IfcBoundedCurve.super_IfcCurve.field_0x40);
  return;
}

Assistant:

IfcPolyline() : Object("IfcPolyline") {}